

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

int fwd_aa_tab_clear(jit_State *J,IRRef lim,IRRef ta)

{
  ushort uVar1;
  IRIns *J_00;
  AliasRet AVar2;
  ulong uVar3;
  
  uVar1 = J->chain[0x62];
  if (lim < uVar1) {
    J_00 = (J->cur).ir;
    do {
      uVar3 = (ulong)uVar1;
      if (*(short *)((long)J_00 + uVar3 * 8 + 2) == 0x22) {
        if (J_00[uVar3].field_0.op1 == ta) {
          return 0;
        }
        AVar2 = aa_table((jit_State *)&J_00->field_0,ta,(uint)J_00[uVar3].field_0.op1);
        if (AVar2 != ALIAS_NO) {
          return 0;
        }
      }
      uVar1 = *(ushort *)((long)J_00 + uVar3 * 8 + 6);
    } while ((ushort)lim < uVar1);
  }
  return 1;
}

Assistant:

static int fwd_aa_tab_clear(jit_State *J, IRRef lim, IRRef ta)
{
  IRRef ref = J->chain[IR_CALLS];
  while (ref > lim) {
    IRIns *calls = IR(ref);
    if (calls->op2 == IRCALL_lj_tab_clear &&
	(ta == calls->op1 || aa_table(J, ta, calls->op1) != ALIAS_NO))
      return 0;  /* Conflict. */
    ref = calls->prev;
  }
  return 1;  /* No conflict. Can safely FOLD/CSE. */
}